

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

ostream * wasm::printExpression
                    (Expression *expression,ostream *o,bool minify,bool full,Module *wasm)

{
  bool bVar1;
  undefined1 local_1b8 [8];
  PrintSExpression print;
  Module *wasm_local;
  bool full_local;
  bool minify_local;
  ostream *o_local;
  Expression *expression_local;
  
  print.typePrinter.fallbackNames._M_h._M_single_bucket = (__node_base_ptr)wasm;
  if (expression == (Expression *)0x0) {
    std::operator<<(o,"(null expression)");
  }
  else {
    PrintSExpression::PrintSExpression((PrintSExpression *)local_1b8,o);
    PrintSExpression::setMinify((PrintSExpression *)local_1b8,minify);
    print.moduleStackIR.super__Optional_base<wasm::ModuleStackIR,_false,_false>._M_payload.
    super__Optional_payload<wasm::ModuleStackIR,_true,_false,_false>.
    super__Optional_payload_base<wasm::ModuleStackIR>._56_8_ =
         print.typePrinter.fallbackNames._M_h._M_single_bucket;
    if ((full) || (bVar1 = anon_unknown_0::isFullForced(), bVar1)) {
      PrintSExpression::setFull((PrintSExpression *)local_1b8,true);
    }
    PrintSExpression::visit((PrintSExpression *)local_1b8,expression);
    if ((full) || (bVar1 = anon_unknown_0::isFullForced(), bVar1)) {
      std::operator<<(o," (; ");
      anon_unknown_0::printTypeOrName
                ((Type)(expression->type).id,o,
                 (Module *)print.typePrinter.fallbackNames._M_h._M_single_bucket);
      std::operator<<(o," ;)");
    }
    PrintSExpression::~PrintSExpression((PrintSExpression *)local_1b8);
  }
  return o;
}

Assistant:

static std::ostream& printExpression(Expression* expression,
                                     std::ostream& o,
                                     bool minify,
                                     bool full,
                                     Module* wasm) {
  if (!expression) {
    o << "(null expression)";
    return o;
  }
  PrintSExpression print(o);
  print.setMinify(minify);
  print.currModule = wasm;
  if (full || isFullForced()) {
    print.setFull(true);
  }
  print.visit(expression);
  if (full || isFullForced()) {
    o << " (; ";
    printTypeOrName(expression->type, o, wasm);
    o << " ;)";
  }
  return o;
}